

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O0

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>const,1,3,true>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>const,3,1,true>const>>,3,2>
       ::
       run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>const,1,3,true>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>const,3,1,true>const>>
                 (redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_1,_3,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>_>
                  *eval,scalar_sum_op<double,_double> *func,
                 CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_1,_3,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>
                 *xpr)

{
  bool bVar1;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_1,_3,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>
  *pCVar2;
  Index IVar3;
  result_type rVar4;
  double adVar5 [2];
  Scalar local_40;
  double local_38 [2];
  result_type local_28;
  Scalar res;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_1,_3,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>
  *xpr_local;
  scalar_sum_op<double,_double> *func_local;
  redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_1,_3,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>_>
  *eval_local;
  
  res = (Scalar)xpr;
  xpr_local = (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_1,_3,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>
               *)func;
  func_local = (scalar_sum_op<double,_double> *)eval;
  IVar3 = CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_1,_3,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>
          ::rows(xpr);
  bVar1 = false;
  if (0 < IVar3) {
    IVar3 = CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_1,_3,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>
            ::cols((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_1,_3,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>
                    *)res);
    bVar1 = false;
    if (0 < IVar3) {
      bVar1 = true;
    }
  }
  pCVar2 = xpr_local;
  if (!bVar1) {
    __assert_fail("xpr.rows()>0 && xpr.cols()>0 && \"you are using an empty matrix\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/Redux.h"
                  ,0x156,
                  "static Scalar Eigen::internal::redux_impl<Eigen::internal::scalar_sum_op<double>, Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Transpose<const Eigen::Block<const Eigen::Transpose<Eigen::Matrix<double, 3, 1>>, 1, 3, true>>, const Eigen::Block<const Eigen::Matrix<double, 3, 3>, 3, 1, true>>>>::run(const Evaluator &, const Func &, const XprType &) [Func = Eigen::internal::scalar_sum_op<double>, Evaluator = Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Transpose<const Eigen::Block<const Eigen::Transpose<Eigen::Matrix<double, 3, 1>>, 1, 3, true>>, const Eigen::Block<const Eigen::Matrix<double, 3, 3>, 3, 1, true>>>, Traversal = 3, Unrolling = 2, XprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Transpose<const Eigen::Block<const Eigen::Transpose<Eigen::Matrix<double, 3, 1>>, 1, 3, true>>, const Eigen::Block<const Eigen::Matrix<double, 3, 3>, 3, 1, true>>]"
                 );
  }
  adVar5 = redux_vec_unroller<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>const,1,3,true>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>const,3,1,true>const>>,0,1>
           ::run<double__vector(2)>
                     ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_1,_3,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>_>
                       *)func_local,(scalar_sum_op<double,_double> *)xpr_local);
  local_38[0] = adVar5[0];
  local_28 = scalar_sum_op<double,double>::predux<double__vector(2)>
                       ((scalar_sum_op<double,double> *)pCVar2,&local_38);
  pCVar2 = xpr_local;
  local_40 = redux_novec_unroller<Eigen::internal::scalar_sum_op<double,_double>,_Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_1,_3,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>_>,_2,_1>
             ::run((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_1,_3,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>_>
                    *)func_local,(scalar_sum_op<double,_double> *)xpr_local);
  rVar4 = scalar_sum_op<double,_double>::operator()
                    ((scalar_sum_op<double,_double> *)pCVar2,&local_28,&local_40);
  return rVar4;
}

Assistant:

EIGEN_DEVICE_FUNC static EIGEN_STRONG_INLINE
  Scalar run(const Evaluator &eval, const Func& func, const XprType &xpr)
  {
    EIGEN_ONLY_USED_FOR_DEBUG(xpr)
    eigen_assert(xpr.rows()>0 && xpr.cols()>0 && "you are using an empty matrix");
    if (VectorizedSize > 0) {
      Scalar res = func.predux(redux_vec_unroller<Func, Evaluator, 0, Size / PacketSize>::template run<PacketType>(eval,func));
      if (VectorizedSize != Size)
        res = func(res,redux_novec_unroller<Func, Evaluator, VectorizedSize, Size-VectorizedSize>::run(eval,func));
      return res;
    }
    else {
      return redux_novec_unroller<Func, Evaluator, 0, Size>::run(eval,func);
    }
  }